

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<292U,_Fixpp::Type::Char>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  char cVar1;
  ostream *poVar2;
  undefined4 in_register_0000003c;
  
  cVar1 = *__buf;
  poVar2 = std::ostream::_M_insert<unsigned_long>(CONCAT44(in_register_0000003c,__fd));
  poVar2 = std::operator<<(poVar2,"=");
  poVar2 = std::operator<<(poVar2,cVar1);
  std::operator<<(poVar2,'|');
  return CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }